

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> * __thiscall
QPDF::getCompressibleObjGens<QPDFObjGen>
          (vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *__return_storage_ptr__,QPDF *this)

{
  allocator<bool> *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer pMVar5;
  _Bit_pointer __n;
  size_type __n_00;
  reference pvVar6;
  logic_error *this_01;
  pointer this_02;
  pointer ppVar7;
  QPDFObjectHandle *this_03;
  pointer ppVar8;
  reference rVar9;
  bool local_332;
  bool local_31a;
  undefined1 local_260 [16];
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_250;
  const_iterator local_248;
  undefined1 local_240 [8];
  Array items;
  const_reverse_iterator iter_1;
  const_reverse_iterator end_1;
  Dictionary dict_1;
  QPDFObjectHandle *value;
  string *key;
  const_reverse_iterator iter;
  const_reverse_iterator end;
  undefined1 local_1d8 [8];
  Dictionary dict;
  string local_1c0;
  byte local_19b;
  byte local_19a;
  allocator<char> local_199;
  string local_198;
  byte local_173;
  byte local_172;
  allocator<char> local_171;
  string local_170;
  byte local_14b;
  byte local_14a;
  allocator<char> local_149;
  string local_148;
  reference local_128;
  size_t local_118;
  _Self local_110;
  _Self local_108;
  iterator upper;
  reference local_f8;
  int local_e4;
  _Bit_pointer local_e0;
  size_t id;
  QPDFObjGen og;
  value_type obj;
  undefined1 local_b8 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  undefined1 local_98 [8];
  vector<bool,_std::allocator<bool>_> visited;
  size_t max_obj;
  QPDFObjGen encryption_dict_og;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  QPDFObjectHandle encryption_dict;
  QPDF *this_local;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *result;
  
  encryption_dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/Encrypt",&local_49);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_28,(string *)&pMVar5->trailer);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  register0x00000000 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_28);
  __n = (_Bit_pointer)getObjectCount(this);
  queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  this_00 = (allocator<bool> *)
            ((long)&queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = __n;
  std::allocator<bool>::allocator(this_00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_98,(size_type)__n,
             (bool *)((long)&queue.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_00);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&queue.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_b8);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_b8,0x200);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_b8,
             &pMVar5->trailer);
  std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::vector(__return_storage_ptr__);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  __n_00 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::size(&pMVar5->obj_cache);
  std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::reserve(__return_storage_ptr__,__n_00);
  do {
    bVar1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_b8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      upper._M_node._4_4_ = 1;
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_b8);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_98);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
      return __return_storage_ptr__;
    }
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_b8);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&og,pvVar6);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::pop_back
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_b8);
    iVar3 = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)&og);
    if (iVar3 < 1) {
LAB_00396fb3:
      bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&og);
      if (bVar1) {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)&end);
        QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)local_1d8,(typed)&end);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&end);
        ::qpdf::BaseDictionary::crend_abi_cxx11_(&iter,(BaseDictionary *)local_1d8);
        ::qpdf::BaseDictionary::crbegin_abi_cxx11_
                  ((const_reverse_iterator *)&key,(BaseDictionary *)local_1d8);
        while( true ) {
          bVar1 = std::operator!=((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                   *)&key,&iter);
          if (!bVar1) break;
          ppVar8 = std::
                   reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                   ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                 *)&key);
          ppVar7 = std::
                   reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                   ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                 *)&key);
          this_03 = &ppVar7->second;
          bVar1 = ::qpdf::BaseHandle::null(&this_03->super_BaseHandle);
          if (!bVar1) {
            bVar1 = std::operator==(&ppVar8->first,"/Length");
            if (bVar1) {
              bVar1 = QPDFObjectHandle::isIndirect(this_03);
              if (bVar1) {
                QTC::TC("qpdf","QPDF exclude indirect length",0);
              }
            }
            else {
              std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
              emplace_back<QPDFObjectHandle_const&>
                        ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)local_b8,
                         this_03);
            }
          }
          std::
          reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
          ::operator++((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                        *)&key);
        }
        ::qpdf::Dictionary::~Dictionary((Dictionary *)local_1d8);
      }
      else {
        bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&og);
        if (bVar1) {
          QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&end_1,(typed)&og);
          ::qpdf::BaseDictionary::crend_abi_cxx11_(&iter_1,(BaseDictionary *)&end_1);
          ::qpdf::BaseDictionary::crbegin_abi_cxx11_
                    ((const_reverse_iterator *)&items.sp_elements,(BaseDictionary *)&end_1);
          while( true ) {
            bVar1 = std::operator!=((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                     *)&items.sp_elements,&iter_1);
            if (!bVar1) break;
            ppVar8 = std::
                     reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                     ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                   *)&items.sp_elements);
            bVar1 = ::qpdf::BaseHandle::null(&(ppVar8->second).super_BaseHandle);
            if (!bVar1) {
              ppVar8 = std::
                       reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                       ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                     *)&items.sp_elements);
              std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
              emplace_back<QPDFObjectHandle_const&>
                        ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)local_b8,
                         &ppVar8->second);
            }
            std::
            reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
            ::operator++((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                          *)&items.sp_elements);
          }
          ::qpdf::Dictionary::~Dictionary((Dictionary *)&end_1);
        }
        else {
          QPDFObjectHandle::as_array((Array *)local_240,(QPDFObjectHandle *)&og,any);
          bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_240);
          if (bVar1) {
            local_250._M_current =
                 (QPDFObjectHandle *)
                 std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                           ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_b8)
            ;
            __gnu_cxx::
            __normal_iterator<QPDFObjectHandle_const*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
            ::__normal_iterator<QPDFObjectHandle*>
                      ((__normal_iterator<QPDFObjectHandle_const*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
                        *)&local_248,&local_250);
            ::qpdf::Array::crbegin((Array *)(local_260 + 8));
            ::qpdf::Array::crend((Array *)local_260);
            std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
            insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<QPDFObjectHandle_const*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>>,void>
                      ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)local_b8,
                       local_248,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                        *)(local_260 + 8),
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                        *)local_260);
          }
          ::qpdf::Array::~Array((Array *)local_240);
        }
      }
      upper._M_node._4_4_ = 0;
    }
    else {
      id = (size_t)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&og);
      local_e4 = QPDFObjGen::getObj((QPDFObjGen *)&id);
      local_e4 = local_e4 + -1;
      local_e0 = (_Bit_pointer)toS<int>(&local_e4);
      if (visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage <= local_e0) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_01,"unexpected object id encountered in getCompressibleObjGens");
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_98,(size_type)local_e0);
      local_f8 = rVar9;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_f8);
      if (bVar1) {
        QTC::TC("qpdf","QPDF loop detected traversing objects",0);
        upper._M_node._4_4_ = 2;
      }
      else {
        pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        local_108._M_node =
             (_Base_ptr)
             std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::upper_bound(&pMVar5->obj_cache,(key_type *)&id);
        pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        local_110._M_node =
             (_Base_ptr)
             std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::end(&pMVar5->obj_cache);
        bVar2 = std::operator!=(&local_108,&local_110);
        bVar1 = false;
        if (bVar2) {
          this_02 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator->
                              (&local_108);
          iVar3 = QPDFObjGen::getObj(&this_02->first);
          iVar4 = QPDFObjGen::getObj((QPDFObjGen *)&id);
          bVar1 = iVar3 == iVar4;
        }
        if (!bVar1) {
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_98,(size_type)local_e0);
          local_128 = rVar9;
          std::_Bit_reference::operator=(&local_128,true);
          bVar1 = QPDFObjGen::operator==((QPDFObjGen *)&id,(QPDFObjGen *)((long)&max_obj + 4));
          if (bVar1) {
            QTC::TC("qpdf","QPDF exclude encryption dictionary",0);
          }
          else {
            local_14a = 0;
            local_14b = 0;
            local_172 = 0;
            local_173 = 0;
            local_19a = 0;
            local_19b = 0;
            dict.super_BaseDictionary.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
            dict.super_BaseDictionary.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ = 0;
            bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&og);
            local_31a = true;
            if (!bVar1) {
              std::allocator<char>::allocator();
              local_14a = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"/Sig",&local_149);
              local_14b = 1;
              std::allocator<char>::allocator();
              local_172 = 1;
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"",&local_171)
              ;
              local_173 = 1;
              bVar1 = QPDFObjectHandle::isDictionaryOfType
                                ((QPDFObjectHandle *)&og,&local_148,&local_170);
              local_332 = false;
              if (bVar1) {
                std::allocator<char>::allocator();
                local_19a = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_198,"/ByteRange",&local_199);
                local_19b = 1;
                bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&og,&local_198);
                local_332 = false;
                if (bVar1) {
                  std::allocator<char>::allocator();
                  dict.super_BaseDictionary.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
                       = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c0,"/Contents",
                             (allocator<char> *)
                             ((long)&dict.super_BaseDictionary.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 7));
                  dict.super_BaseDictionary.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
                       = 1;
                  local_332 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&og,&local_1c0);
                }
              }
              local_31a = local_332;
            }
            if ((dict.super_BaseDictionary.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
                & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_1c0);
            }
            if ((dict.super_BaseDictionary.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
                & 1) != 0) {
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&dict.super_BaseDictionary.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
            }
            if ((local_19b & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_198);
            }
            if ((local_19a & 1) != 0) {
              std::allocator<char>::~allocator(&local_199);
            }
            if ((local_173 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_170);
            }
            if ((local_172 & 1) != 0) {
              std::allocator<char>::~allocator(&local_171);
            }
            if ((local_14b & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_148);
            }
            if ((local_14a & 1) != 0) {
              std::allocator<char>::~allocator(&local_149);
            }
            if (((local_31a ^ 0xffU) & 1) != 0) {
              std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::push_back
                        (__return_storage_ptr__,(value_type *)&id);
            }
          }
          goto LAB_00396fb3;
        }
        local_118 = id;
        removeObject(this,(QPDFObjGen)id);
        upper._M_node._4_4_ = 2;
      }
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&og);
  } while( true );
}

Assistant:

std::vector<T>
QPDF::getCompressibleObjGens()
{
    // Return a list of objects that are allowed to be in object streams.  Walk through the objects
    // by traversing the document from the root, including a traversal of the pages tree.  This
    // makes that objects that are on the same page are more likely to be in the same object stream,
    // which is slightly more efficient, particularly with linearized files.  This is better than
    // iterating through the xref table since it avoids preserving orphaned items.

    // Exclude encryption dictionary, if any
    QPDFObjectHandle encryption_dict = m->trailer.getKey("/Encrypt");
    QPDFObjGen encryption_dict_og = encryption_dict.getObjGen();

    const size_t max_obj = getObjectCount();
    std::vector<bool> visited(max_obj, false);
    std::vector<QPDFObjectHandle> queue;
    queue.reserve(512);
    queue.push_back(m->trailer);
    std::vector<T> result;
    if constexpr (std::is_same_v<T, QPDFObjGen>) {
        result.reserve(m->obj_cache.size());
    } else if constexpr (std::is_same_v<T, bool>) {
        result.resize(max_obj + 1U, false);
    } else {
        throw std::logic_error("Unsupported type in QPDF::getCompressibleObjGens");
    }
    while (!queue.empty()) {
        auto obj = queue.back();
        queue.pop_back();
        if (obj.getObjectID() > 0) {
            QPDFObjGen og = obj.getObjGen();
            const size_t id = toS(og.getObj() - 1);
            if (id >= max_obj) {
                throw std::logic_error(
                    "unexpected object id encountered in getCompressibleObjGens");
            }
            if (visited[id]) {
                QTC::TC("qpdf", "QPDF loop detected traversing objects");
                continue;
            }

            // Check whether this is the current object. If not, remove it (which changes it into a
            // direct null and therefore stops us from revisiting it) and move on to the next object
            // in the queue.
            auto upper = m->obj_cache.upper_bound(og);
            if (upper != m->obj_cache.end() && upper->first.getObj() == og.getObj()) {
                removeObject(og);
                continue;
            }

            visited[id] = true;

            if (og == encryption_dict_og) {
                QTC::TC("qpdf", "QPDF exclude encryption dictionary");
            } else if (!(obj.isStream() ||
                         (obj.isDictionaryOfType("/Sig") && obj.hasKey("/ByteRange") &&
                          obj.hasKey("/Contents")))) {
                if constexpr (std::is_same_v<T, QPDFObjGen>) {
                    result.push_back(og);
                } else if constexpr (std::is_same_v<T, bool>) {
                    result[id + 1U] = true;
                }
            }
        }
        if (obj.isStream()) {
            auto dict = obj.getDict().as_dictionary();
            auto end = dict.crend();
            for (auto iter = dict.crbegin(); iter != end; ++iter) {
                std::string const& key = iter->first;
                QPDFObjectHandle const& value = iter->second;
                if (!value.null()) {
                    if (key == "/Length") {
                        // omit stream lengths
                        if (value.isIndirect()) {
                            QTC::TC("qpdf", "QPDF exclude indirect length");
                        }
                    } else {
                        queue.emplace_back(value);
                    }
                }
            }
        } else if (obj.isDictionary()) {
            auto dict = obj.as_dictionary();
            auto end = dict.crend();
            for (auto iter = dict.crbegin(); iter != end; ++iter) {
                if (!iter->second.null()) {
                    queue.emplace_back(iter->second);
                }
            }
        } else if (auto items = obj.as_array()) {
            queue.insert(queue.end(), items.crbegin(), items.crend());
        }
    }

    return result;
}